

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>::dispose
          (Array<const_kj::ArrayPtr<const_unsigned_char>_> *this)

{
  ArrayPtr<const_unsigned_char> *firstElement;
  size_t elementCount;
  size_t sizeCopy;
  ArrayPtr<const_unsigned_char> *ptrCopy;
  Array<const_kj::ArrayPtr<const_unsigned_char>_> *this_local;
  
  firstElement = this->ptr;
  elementCount = this->size_;
  if (firstElement != (ArrayPtr<const_unsigned_char> *)0x0) {
    this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->size_ = 0;
    ArrayDisposer::dispose<kj::ArrayPtr<unsigned_char_const>const>
              (this->disposer,firstElement,elementCount,elementCount);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }